

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream *
QtPrivate::writeAssociativeContainer<QHash<QFont::Tag,unsigned_int>>
          (QDataStream *s,QHash<QFont::Tag,_unsigned_int> *c)

{
  long lVar1;
  QDataStream *this;
  int iVar2;
  ulong uVar3;
  Data *pDVar4;
  size_t sVar5;
  ulong uVar6;
  
  if (c->d == (Data *)0x0) {
    sVar5 = 0;
LAB_0048e73c:
    iVar2 = (int)sVar5;
LAB_0048e742:
    QDataStream::operator<<(s,iVar2);
  }
  else {
    sVar5 = c->d->size;
    if ((long)sVar5 < 0xfffffffe) goto LAB_0048e73c;
    if (*(int *)(s + 0x18) < 0x16) {
      if (sVar5 != 0xfffffffe) {
        QDataStream::setStatus((Status)s);
        return s;
      }
      iVar2 = -2;
      goto LAB_0048e742;
    }
    this = (QDataStream *)QDataStream::operator<<(s,-2);
    QDataStream::operator<<(this,sVar5);
  }
  pDVar4 = c->d;
  if (pDVar4 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
    uVar6 = 0;
  }
  else {
    if (pDVar4->spans->offsets[0] != 0xff) {
      uVar6 = 0;
      goto LAB_0048e7c0;
    }
    uVar3 = 1;
    do {
      uVar6 = uVar3;
      if (pDVar4->numBuckets == uVar6) {
        pDVar4 = (Data *)0x0;
        uVar6 = 0;
        break;
      }
      uVar3 = uVar6 + 1;
    } while (pDVar4->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
  }
  if (pDVar4 == (Data *)0x0 && uVar6 == 0) {
    return s;
  }
LAB_0048e7c0:
  do {
    lVar1 = (uVar6 >> 3 & 0xfffffffffffffff0) * 9;
    uVar3 = (ulong)((uint)uVar6 & 0x7f);
    QDataStream::operator<<
              (s,*(int *)(*(long *)(pDVar4->spans->offsets + lVar1 + 0x80) +
                         (ulong)pDVar4->spans->offsets[uVar3 + lVar1] * 8));
    QDataStream::operator<<
              (s,*(int *)(*(long *)(pDVar4->spans->offsets + lVar1 + 0x80) + 4 +
                         (ulong)pDVar4->spans->offsets[uVar3 + lVar1] * 8));
    do {
      if (pDVar4->numBuckets - 1 == uVar6) {
        pDVar4 = (Data *)0x0;
        uVar6 = 0;
        break;
      }
      uVar6 = uVar6 + 1;
    } while (pDVar4->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
    if ((pDVar4 == (Data *)0x0) && (uVar6 == 0)) {
      return s;
    }
  } while( true );
}

Assistant:

QDataStream &writeAssociativeContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    auto it = c.constBegin();
    auto end = c.constEnd();
    while (it != end) {
        s << it.key() << it.value();
        ++it;
    }

    return s;
}